

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O1

void __thiscall
QMimeXMLProvider::addFileNameMatches
          (QMimeXMLProvider *this,QString *fileName,QMimeGlobMatchResult *result)

{
  long in_FS_OFFSET;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<bool_(const_QString_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/mimetypes/qmimeprovider.cpp:711:23)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(const_QString_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/mimetypes/qmimeprovider.cpp:711:23)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  QMimeAllGlobPatterns::matchingGlobs
            (&this->m_mimeTypeGlobs,fileName,result,(AddMatchFilterFunc *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeXMLProvider::addFileNameMatches(const QString &fileName, QMimeGlobMatchResult &result)
{
    auto filterFunc = [this](const QString &name) { return !isMimeTypeGlobsExcluded(name); };
    m_mimeTypeGlobs.matchingGlobs(fileName, result, filterFunc);
}